

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall IteratorTest::constructorTest<true>(IteratorTest *this)

{
  int iVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_14;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_15;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_16;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_17;
  bool bVar2;
  reference piVar3;
  reference piVar4;
  reference piVar5;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar6;
  size_t j;
  long lVar7;
  size_t j_3;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_1;
  int scalar;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  bool local_41;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_18;
  
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  it_1.view_._0_1_ = it.index_ == 0;
  test((bool *)&it_1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  scalar = 0x2a;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&it,&scalar,(allocator_type *)&it_1)
  ;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
  iVar1 = *piVar3;
  piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&it,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = iVar1 == *piVar4;
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  scalar = 0x2a;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&it,&scalar,(allocator_type *)&it_1)
  ;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
  iVar1 = *piVar3;
  piVar4 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&it,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = iVar1 == *piVar4;
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  scalar = 0x2a;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)&it,&scalar,(allocator_type *)&it_1
            );
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_false,_std::allocator<unsigned_long>_> *)&it,0);
  piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
  iVar1 = *piVar3;
  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&it,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = iVar1 == *piVar5;
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&it,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_false,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&it)
  ;
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&it,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_false,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&it)
  ;
  begin_05._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 6;
  begin_05._M_current[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&it)
  ;
  begin_06._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 6;
  begin_06._M_current[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&it)
  ;
  begin_07._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 6;
  begin_07._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&it,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_false,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&it)
  ;
  begin_08._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_08._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_08._M_current = 6;
  begin_08._M_current[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&it)
  ;
  begin_09._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_09._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_09._M_current = 6;
  begin_09._M_current[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&it)
  ;
  begin_10._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_10._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_10._M_current = 6;
  begin_10._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&it,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_false,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&it)
  ;
  begin_11._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_11._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_11._M_current = 3;
  begin_11._M_current[1] = 4;
  begin_11._M_current[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_11,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&it)
  ;
  begin_12._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_12._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_12._M_current = 3;
  begin_12._M_current[1] = 4;
  begin_12._M_current[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_12,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&it)
  ;
  begin_13._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_13._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_13._M_current = 3;
  begin_13._M_current[1] = 4;
  begin_13._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&it,begin_13,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_false,_std::allocator<unsigned_long>_> *)&it,0);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&it)
  ;
  begin_14._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_14._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_14._M_current = 3;
  begin_14._M_current[1] = 4;
  begin_14._M_current[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_14,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&it)
  ;
  begin_15._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_15._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_15._M_current = 3;
  begin_15._M_current[1] = 4;
  begin_15._M_current[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&it,begin_15,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_true,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)&scalar,(View<int,_true,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&it)
  ;
  begin_16._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_16._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_16._M_current = 3;
  begin_16._M_current[1] = 4;
  begin_16._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&it,begin_16,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&it_1,(View<int,_false,_std::allocator<unsigned_long>_> *)&it,0xc);
  scalar = CONCAT31(scalar._1_3_,it_1.index_ == 0xc);
  test((bool *)&scalar);
  for (lVar7 = 0xc; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it_1);
    scalar = CONCAT31(scalar._1_3_,*piVar3 == this->data_[lVar7]);
    test((bool *)&scalar);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it_1);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&scalar,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  bVar2 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&it_1,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&scalar);
  if (bVar2) {
    pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it_1);
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  }
  else {
    shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape_18);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_18,1,(allocator_type *)&it);
  begin_17._M_current._1_7_ =
       shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_17._M_current._0_1_ =
       shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_17._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&it,begin_17,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it_1);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&scalar,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_1,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&scalar);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&it_1);
  for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
    piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar3 == this->data_[lVar7];
    test((bool *)&shape);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&it);
  local_41 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,true,std::allocator<unsigned_long>> *)&scalar,
                        (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  test(&local_41);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  pIVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar);
  piVar3 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar6);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = *piVar3 == 0x2e;
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it_1.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)&it.pointer_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void IteratorTest::constructorTest(){
    // empty
    {
        andres::Iterator<int, constTarget> it;
        test(it.index() == 0);
    }
    // view and index
    {
        // scalar
        {
            int scalar = 42;
            andres::View<int, constTarget> v(&scalar);
            andres::Iterator<int, constTarget> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            const andres::View<int, true> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            andres::View<int, false> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        // 1D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 2D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 3D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
    }
    // conversion from mutable to const
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, false> it;
        it = v.begin();
        andres::Iterator<int, true> itc(it);

        for(int i = 0; i < 24; ++i){
            test(*itc == data_[i]);
            ++itc;
        }
        test(itc == v.end());
        test(*(--itc)==46);
    }
}